

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.c
# Opt level: O0

void monitor_list_destroy(monitor_list *monitor_list)

{
  monitor_list *monitor_list_local;
  
  free(monitor_list->extension);
  monitors_destroy(monitor_list->monitors);
  list_destroy(monitor_list->monitors);
  free(monitor_list);
  return;
}

Assistant:

void monitor_list_destroy(struct monitor_list *monitor_list)
{
        free(monitor_list->extension);
        monitors_destroy(monitor_list->monitors);
        list_destroy(monitor_list->monitors);
        free(monitor_list);
}